

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.h
# Opt level: O3

void __thiscall Heap::sort_up(Heap *this,GridNode *item)

{
  int iVar1;
  int iVar2;
  GridNode *pGVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  
  iVar1 = item->hCost;
  iVar4 = item->index;
  iVar6 = (iVar4 - (iVar4 + -1 >> 0x1f)) + -1 >> 1;
  iVar2 = this->maxCount;
  iVar5 = 0;
  if (0 < iVar6) {
    iVar5 = iVar6;
  }
  if (iVar2 <= iVar6) {
    iVar5 = iVar2 + -1;
  }
  iVar6 = item->gCost;
  while( true ) {
    pGVar3 = this->list[iVar5];
    iVar5 = (pGVar3->gCost + pGVar3->hCost) - (iVar6 + iVar1);
    if (iVar5 == 0) {
      iVar5 = pGVar3->hCost - iVar1;
    }
    if (iVar5 < 1) break;
    this->list[iVar4] = pGVar3;
    iVar5 = pGVar3->index;
    this->list[iVar5] = item;
    iVar4 = iVar4 + iVar5;
    item->index = iVar4;
    iVar4 = iVar4 - pGVar3->index;
    pGVar3->index = iVar4;
    iVar4 = item->index - iVar4;
    item->index = iVar4;
    iVar7 = (iVar4 - (iVar4 + -1 >> 0x1f)) + -1 >> 1;
    iVar5 = iVar7;
    if (iVar7 < 1) {
      iVar5 = 0;
    }
    if (iVar2 <= iVar7) {
      iVar5 = iVar2 + -1;
    }
  }
  return;
}

Assistant:

void sort_up(GridNode *item)
    {
        int parentIndex = clamp((item->index - 1) / 2, 0, maxCount - 1);
        while (true)
        {
            GridNode *parent = list[parentIndex];
            if (item->compare_item(parent) > 0)
            {
                swap_items(item, parent);
            }
            else
            {
                break;
            }
            parentIndex = clamp((item->index - 1) / 2, 0, maxCount - 1);
        }
    }